

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZMCTargetDesc.c
# Opt level: O2

uint SystemZMC_getFirstReg(uint Reg)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  
  if (SystemZMC_getFirstReg_Initialized == '\0') {
    SystemZMC_getFirstReg_Initialized = '\x01';
    lVar1 = 0;
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      uVar2 = (uint)lVar3;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_GR32Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_GRH32Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_GR64Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_GR128Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_FP32Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_FP64Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_FP128Regs + lVar1)] = uVar2;
      lVar1 = lVar1 + 4;
    }
  }
  return SystemZMC_getFirstReg::Map[Reg];
}

Assistant:

unsigned SystemZMC_getFirstReg(unsigned Reg)
{
	static unsigned Map[SystemZ_NUM_TARGET_REGS];
	static int Initialized = 0;
	unsigned I;

	if (!Initialized) {
		Initialized = 1;
		for (I = 0; I < 16; ++I) {
			Map[SystemZMC_GR32Regs[I]] = I;
			Map[SystemZMC_GRH32Regs[I]] = I;
			Map[SystemZMC_GR64Regs[I]] = I;
			Map[SystemZMC_GR128Regs[I]] = I;
			Map[SystemZMC_FP32Regs[I]] = I;
			Map[SystemZMC_FP64Regs[I]] = I;
			Map[SystemZMC_FP128Regs[I]] = I;
		}
	}

	// assert(Reg < SystemZ_NUM_TARGET_REGS);
	return Map[Reg];
}